

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlantUmlGenerator.cpp
# Opt level: O0

void __thiscall
PlantUmlGenerator::deferralLink
          (PlantUmlGenerator *this,ostream *output,string *indent,ScName *stateAlias,
          ScName *eventName)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_50 [8];
  ScName eventNameShort;
  ScName *eventName_local;
  ScName *stateAlias_local;
  string *indent_local;
  ostream *output_local;
  PlantUmlGenerator *this_local;
  
  eventNameShort.field_2._8_8_ = eventName;
  removeNamespaces((ScName *)local_50,eventName);
  bVar1 = ::AbstractGenerator::isHighlighted
                    (&this->super_AbstractGenerator,(ScName *)eventNameShort.field_2._8_8_);
  if (bVar1) {
    poVar2 = std::operator<<(output,(string *)indent);
    poVar2 = std::operator<<(poVar2,(string *)stateAlias);
    poVar2 = std::operator<<(poVar2," : * <b>");
    poVar2 = std::operator<<(poVar2,(string *)local_50);
    std::operator<<(poVar2,"</b>\n");
  }
  else {
    poVar2 = std::operator<<(output,(string *)indent);
    poVar2 = std::operator<<(poVar2,(string *)stateAlias);
    poVar2 = std::operator<<(poVar2," : * ");
    poVar2 = std::operator<<(poVar2,(string *)local_50);
    std::operator<<(poVar2,"\n");
  }
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void PlantUmlGenerator::deferralLink(std::ostream &output, std::string &indent,
                                     const ScName &stateAlias, const ScName &eventName)
{
    const ScName eventNameShort = removeNamespaces(eventName);

    if (isHighlighted(eventName)) {
        output << indent << stateAlias << " : * <b>" << eventNameShort << "</b>\n";
    } else {
        output << indent << stateAlias << " : * " << eventNameShort << "\n";
    }
}